

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibEvalAssignNums(Dar_Man_t *p,int Class,Aig_Obj_t *pRoot)

{
  Aig_Man_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  Dar_LibObj_t *pDVar2;
  Dar_LibDat_t *pDVar3;
  Dar_LibObj_t *pDVar4;
  Dar_LibDat_t *pDVar5;
  Dar_LibDat_t *pDVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *p_02;
  Aig_Obj_t *pAVar8;
  float fVar9;
  int local_54;
  float Prob;
  int i;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Dar_LibDat_t *pData1;
  Dar_LibDat_t *pData0;
  Dar_LibDat_t *pData;
  Dar_LibObj_t *pObj;
  Aig_Obj_t *pRoot_local;
  int Class_local;
  Dar_Man_t *p_local;
  
  local_54 = 0;
  while( true ) {
    if (s_DarLib->nNodes0[Class] <= local_54) {
      return;
    }
    pDVar2 = Dar_LibObj(s_DarLib,s_DarLib->pNodes0[Class][local_54]);
    *pDVar2 = (Dar_LibObj_t)((ulong)*pDVar2 & 0xfffffffff | (ulong)(local_54 + 4) << 0x24);
    if (s_DarLib->nNodes0Max + 4 <= (int)(SUB84(*pDVar2,4) >> 4)) {
      __assert_fail("(int)pObj->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                    ,0x331,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
    }
    pDVar3 = s_DarLib->pDatas + (int)(SUB84(*pDVar2,4) >> 4);
    pDVar3->fMffc = '\0';
    (pDVar3->field_0).pFunc = (Aig_Obj_t *)0x0;
    pDVar3->TravId = 0xffff;
    pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pDVar2,0) & 0xffff);
    if (s_DarLib->nNodes0Max + 4 <= (int)(SUB84(*pDVar4,4) >> 4)) {
      __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                    ,0x338,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
    }
    pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pDVar2,2) & 0xffff);
    if (s_DarLib->nNodes0Max + 4 <= (int)(SUB84(*pDVar4,4) >> 4)) break;
    pDVar5 = s_DarLib->pDatas;
    pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pDVar2,0) & 0xffff);
    pDVar5 = pDVar5 + (int)(SUB84(*pDVar4,4) >> 4);
    pDVar6 = s_DarLib->pDatas;
    pDVar4 = Dar_LibObj(s_DarLib,SUB84(*pDVar2,2) & 0xffff);
    pDVar6 = pDVar6 + (int)(SUB84(*pDVar4,4) >> 4);
    iVar1 = Abc_MaxInt(pDVar5->Level,pDVar6->Level);
    pDVar3->Level = iVar1 + 1;
    if (((pDVar5->field_0).pFunc != (Aig_Obj_t *)0x0) &&
       ((pDVar6->field_0).pFunc != (Aig_Obj_t *)0x0)) {
      pAVar7 = Aig_NotCond((pDVar5->field_0).pFunc,SUB84(*pDVar2,4) & 1);
      p_02 = Aig_NotCond((pDVar6->field_0).pFunc,SUB84(*pDVar2,4) >> 1 & 1);
      pAVar8 = Aig_Regular(pAVar7);
      if ((pAVar8 != pRoot) && (pAVar8 = Aig_Regular(p_02), pAVar8 != pRoot)) {
        pAVar7 = Aig_TableLookupTwo(p->pAig,pAVar7,p_02);
        (pDVar3->field_0).pFunc = pAVar7;
        if ((pDVar3->field_0).pFunc != (Aig_Obj_t *)0x0) {
          pAVar7 = Aig_Regular((pDVar3->field_0).pFunc);
          pDVar3->Level = (uint)((ulong)*(undefined8 *)&pAVar7->field_0x18 >> 0x20) & 0xffffff;
          p_00 = p->pAig;
          pAVar7 = Aig_Regular((pDVar3->field_0).pFunc);
          iVar1 = Aig_ObjIsTravIdCurrent(p_00,pAVar7);
          pDVar3->fMffc = (uchar)iVar1;
          if (p->pPars->fPower != 0) {
            p_01 = p->pAig->vProbs;
            pAVar7 = Aig_Regular((pDVar3->field_0).pFunc);
            iVar1 = Aig_ObjId(pAVar7);
            iVar1 = Vec_IntEntry(p_01,iVar1);
            fVar9 = Abc_Int2Float(iVar1);
            iVar1 = Aig_IsComplement((pDVar3->field_0).pFunc);
            if (iVar1 != 0) {
              fVar9 = 1.0 - fVar9;
            }
            pDVar3->dProb = fVar9;
          }
        }
      }
    }
    local_54 = local_54 + 1;
  }
  __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                ,0x339,"void Dar_LibEvalAssignNums(Dar_Man_t *, int, Aig_Obj_t *)");
}

Assistant:

void Dar_LibEvalAssignNums( Dar_Man_t * p, int Class, Aig_Obj_t * pRoot )
{
    Dar_LibObj_t * pObj;
    Dar_LibDat_t * pData, * pData0, * pData1;
    Aig_Obj_t * pFanin0, * pFanin1;
    int i;
    for ( i = 0; i < s_DarLib->nNodes0[Class]; i++ )
    {
        // get one class node, assign its temporary number and set its data
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pNodes0[Class][i]);
        pObj->Num = 4 + i;
        assert( (int)pObj->Num < s_DarLib->nNodes0Max + 4 );
        pData = s_DarLib->pDatas + pObj->Num;
        pData->fMffc = 0;
        pData->pFunc = NULL;
        pData->TravId = 0xFFFF;

        // explore the fanins
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4 );
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4 );
        pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->Level = 1 + Abc_MaxInt(pData0->Level, pData1->Level);
        if ( pData0->pFunc == NULL || pData1->pFunc == NULL )
            continue;
        pFanin0 = Aig_NotCond( pData0->pFunc, pObj->fCompl0 );
        pFanin1 = Aig_NotCond( pData1->pFunc, pObj->fCompl1 );
        if ( Aig_Regular(pFanin0) == pRoot || Aig_Regular(pFanin1) == pRoot )
            continue;
        pData->pFunc = Aig_TableLookupTwo( p->pAig, pFanin0, pFanin1 );
        if ( pData->pFunc )
        {
            // update the level to be more accurate
            pData->Level = Aig_Regular(pData->pFunc)->Level;
            // mark the node if it is part of MFFC
            pData->fMffc = Aig_ObjIsTravIdCurrent(p->pAig, Aig_Regular(pData->pFunc));
            // assign the probability
            if ( p->pPars->fPower )
            {
                float Prob = Abc_Int2Float( Vec_IntEntry( p->pAig->vProbs, Aig_ObjId(Aig_Regular(pData->pFunc)) ) );
                pData->dProb = Aig_IsComplement(pData->pFunc)? 1.0-Prob : Prob;
            }
        }
    }
}